

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***-----------firstProgram.cpp----------***",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***-----------secondProgram.cpp----------***",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***-----------thirdProgram.cpp----------***",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***-----------fouthProgram.cpp----------***",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
    cout<<"***-----------firstProgram.cpp----------***"<<endl<<endl;
    //firstFunction();
    //extern const int externCount;
    //cout<<"经过EXTERN CONST限定符修饰，在其他文件内定义同名CONST变量："<<externCount<<endl;
   // secondFunction();
    //thirdFunction();
    //fouthFunction(6.786);
    cout<<"***-----------secondProgram.cpp----------***"<<endl<<endl;
    //calculateThePrice();
    //getlineTest();
    //vectorTest();
   // ddqTest();
    cout<<"***-----------thirdProgram.cpp----------***"<<endl<<endl;
    //cout<<"sch love you!"<<endl;
    //move_bit();
    cout<<"***-----------fouthProgram.cpp----------***"<<endl<<endl;

    return 0;
}